

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSEngine.cpp
# Opt level: O2

bool __thiscall PSEngine::next_subturn(PSEngine *this)

{
  LogType LVar1;
  element_type *peVar2;
  pointer pRVar3;
  pointer pRVar4;
  string local_1e8;
  ObjectCache *local_1c8;
  string local_1c0;
  string local_1a0 [32];
  string local_180 [32];
  string local_160 [32];
  string local_140 [32];
  string local_120 [32];
  Level local_100;
  Level last_subturn_save;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50 [32];
  
  if ((int)(this->m_config).log_verbosity < 3) {
    peVar2 = (this->m_logger).super___shared_ptr<PSLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__cxx11::string::string(local_120,(string *)&m_engine_log_cat_abi_cxx11_);
    std::__cxx11::string::string<std::allocator<char>>
              (local_140,"--- Subturn start ---",(allocator<char> *)&last_subturn_save);
    (*peVar2->_vptr_PSLogger[2])(peVar2,2,local_120,local_140);
    std::__cxx11::string::~string(local_140);
    std::__cxx11::string::~string(local_120);
  }
  Level::Level(&last_subturn_save,&this->m_current_level);
  local_1e8._M_dataplus._M_p = (pointer)0x0;
  local_1e8._M_string_length = 0;
  local_1e8.field_2._M_allocated_capacity = 0;
  std::vector<PSEngine::SubturnHistory,_std::allocator<PSEngine::SubturnHistory>_>::
  emplace_back<PSEngine::SubturnHistory>
            (&(this->m_turn_history).subturns,(SubturnHistory *)&local_1e8);
  std::vector<PSEngine::RuleDelta,_std::allocator<PSEngine::RuleDelta>_>::~vector
            ((vector<PSEngine::RuleDelta,_std::allocator<PSEngine::RuleDelta>_> *)&local_1e8);
  Level::Level(&local_100,&this->m_current_level);
  local_1c8 = &this->m_object_cache;
  ObjectCache::build_cache(local_1c8,&local_100);
  std::vector<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>::~vector(&local_100.cells);
  pRVar3 = (this->m_compiled_game).rules.
           super__Vector_base<CompiledGame::Rule,_std::allocator<CompiledGame::Rule>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pRVar4 = (this->m_compiled_game).rules.
                super__Vector_base<CompiledGame::Rule,_std::allocator<CompiledGame::Rule>_>._M_impl.
                super__Vector_impl_data._M_start; pRVar4 != pRVar3; pRVar4 = pRVar4 + 1) {
    if ((int)(this->m_config).log_verbosity < 3) {
      peVar2 = (this->m_logger).super___shared_ptr<PSLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::__cxx11::string::string(local_50,(string *)&m_engine_log_cat_abi_cxx11_);
      CompiledGame::Rule::to_string_abi_cxx11_(&local_1e8,pRVar4,false);
      std::operator+(&local_70,"Processing rule : ",&local_1e8);
      (*peVar2->_vptr_PSLogger[2])(peVar2,2,local_50,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::string::~string(local_50);
    }
    apply_rule(this,pRVar4);
  }
  advanced_movement_resolution(this);
  if ((int)(this->m_config).log_verbosity < 3) {
    peVar2 = (this->m_logger).super___shared_ptr<PSLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__cxx11::string::string(local_160,(string *)&m_engine_log_cat_abi_cxx11_);
    std::__cxx11::string::string<std::allocator<char>>
              (local_180,"movement resolved",(allocator<char> *)&local_1e8);
    (*peVar2->_vptr_PSLogger[2])(peVar2,2,local_160,local_180);
    std::__cxx11::string::~string(local_180);
    std::__cxx11::string::~string(local_160);
  }
  pRVar3 = (this->m_compiled_game).late_rules.
           super__Vector_base<CompiledGame::Rule,_std::allocator<CompiledGame::Rule>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pRVar4 = (this->m_compiled_game).late_rules.
                super__Vector_base<CompiledGame::Rule,_std::allocator<CompiledGame::Rule>_>._M_impl.
                super__Vector_impl_data._M_start; LVar1 = (this->m_config).log_verbosity,
      pRVar4 != pRVar3; pRVar4 = pRVar4 + 1) {
    if ((int)LVar1 < 3) {
      peVar2 = (this->m_logger).super___shared_ptr<PSLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::__cxx11::string::string(local_90,(string *)&m_engine_log_cat_abi_cxx11_);
      CompiledGame::Rule::to_string_abi_cxx11_(&local_1e8,pRVar4,false);
      std::operator+(&local_b0,"Processing late rule : ",&local_1e8);
      (*peVar2->_vptr_PSLogger[2])(peVar2,2,local_90,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::string::~string(local_90);
    }
    apply_rule(this,pRVar4);
  }
  if ((int)LVar1 < 3) {
    peVar2 = (this->m_logger).super___shared_ptr<PSLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__cxx11::string::string(local_1a0,(string *)&m_engine_log_cat_abi_cxx11_);
    ObjectCache::to_string_abi_cxx11_(&local_1c0,local_1c8);
    (*peVar2->_vptr_PSLogger[2])(peVar2,2,local_1a0,&local_1c0);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::~string(local_1a0);
  }
  std::vector<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>::~vector(&last_subturn_save.cells);
  return true;
}

Assistant:

bool PSEngine::next_subturn()
{
    PS_LOG("--- Subturn start ---");
    Level last_subturn_save = m_current_level;

    m_turn_history.subturns.push_back(SubturnHistory());

    m_object_cache.build_cache(m_current_level);

    for(const auto& rule : m_compiled_game.rules)
    {
        PS_LOG("Processing rule : " + rule.to_string());
        apply_rule(rule);
    }

    if( !resolve_movements() )
    {
        //todo : for now, movement should always successfully resolve
        //need to decide what to do and add in the history if a movement phase can be considered as unresolved
        //(ie: in puzzlescript there's an option to cancel the whole turn if the player cannot move for example)
        assert(false);
        /*PS_LOG("could not resolve movement, cancelling the turn.");
        m_current_level = last_subturn_save;
        m_turn_history.pop_back();*/
        return false;
    }
    else
    {
        PS_LOG("movement resolved");

        for(const auto& rule : m_compiled_game.late_rules)
        {
            PS_LOG("Processing late rule : " + rule.to_string());
            apply_rule(rule);
        }

        PS_LOG(m_object_cache.to_string());

        return true;
    }
}